

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O2

shared_ptr<RoomBase> RoomMath::getMathAddBR(element_type *param_1)

{
  _func_int *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<RoomBase> sVar3;
  shared_ptr<RoomMath> result;
  anon_class_1_0_00000001 local_29;
  _func_int **local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  std::make_shared<RoomMath>();
  *(undefined4 *)((long)local_28 + 0xc) = 1;
  std::__cxx11::string::assign((char *)(local_28 + 2));
  *(undefined4 *)((long)local_28 + 0x34) = 0x1e;
  p_Var1 = (_func_int *)anon_unknown.dwarf_11b02::timestamp_s();
  local_28[7] = p_Var1;
  local_28[9] = (_func_int *)0x402e000000000000;
  local_28[10] = (_func_int *)0x402e000000000000;
  local_28[8] = (_func_int *)((double)p_Var1 + -15.0);
  std::function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)>::operator=
            ((function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)> *)
             (local_28 + 0x19),&local_29);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  param_1->_vptr_RoomBase = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&param_1->id = _Var2._M_pi;
  local_28 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = param_1;
  return (shared_ptr<RoomBase>)sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getMathAddBR(Parameters parameters) {
        auto result = std::make_shared<RoomMath>();

        result->mode = BattleRoyale;
        result->name = "Math [+,BR]";
        result->poolSize = 30;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 0.25f*60.f;
        result->tBRRoundLength_s = 0.25f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        result->getQuery = [](int a, int b) -> std::pair<std::string, std::string> {
            return {
                std::to_string(a) + "+" + std::to_string(b),
                std::to_string(a+b),
            };
        };

        return result;
    }